

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void * __thiscall
google::protobuf::internal::ExtensionSet::MutableRawRepeatedField
          (ExtensionSet *this,int number,FieldType field_type,bool packed,FieldDescriptor *desc)

{
  Extension *pEVar1;
  anon_union_8_9_fdc4a54a_for_Extension_0 aVar2;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar3;
  
  pVar3 = Insert(this,number);
  pEVar1 = pVar3.first;
  pEVar1->descriptor = desc;
  if (((undefined1  [16])pVar3 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    pEVar1->is_repeated = true;
    pEVar1->field_0xa = pEVar1->field_0xa | 1;
    pEVar1->type = field_type;
    pEVar1->is_packed = packed;
    switch(*(undefined4 *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)field_type * 4)) {
    case 1:
    case 8:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<int>>(this->arena_);
      break;
    case 2:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<long>>(this->arena_);
      break;
    case 3:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_int>>
                        (this->arena_);
      break;
    case 4:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<unsigned_long>>
                        (this->arena_);
      break;
    case 5:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<double>>(this->arena_);
      break;
    case 6:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<float>>(this->arena_);
      break;
    case 7:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedField<bool>>(this->arena_);
      break;
    case 9:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::CreateArenaCompatible<google::protobuf::RepeatedPtrField<std::__cxx11::string>>
                        (this->arena_);
      break;
    case 10:
      aVar2 = (anon_union_8_9_fdc4a54a_for_Extension_0)
              Arena::
              CreateArenaCompatible<google::protobuf::RepeatedPtrField<google::protobuf::MessageLite>>
                        (this->arena_);
      break;
    default:
      goto switchD_0025bab9_default;
    }
    pEVar1->field_0 = aVar2;
  }
switchD_0025bab9_default:
  return (void *)(pEVar1->field_0).int64_t_value;
}

Assistant:

void* ExtensionSet::MutableRawRepeatedField(int number, FieldType field_type,
                                            bool packed,
                                            const FieldDescriptor* desc) {
  Extension* extension;

  // We instantiate an empty Repeated{,Ptr}Field if one doesn't exist for this
  // extension.
  if (MaybeNewExtension(number, desc, &extension)) {
    extension->is_repeated = true;
    extension->is_pointer = true;
    extension->type = field_type;
    extension->is_packed = packed;

    switch (WireFormatLite::FieldTypeToCppType(
        static_cast<WireFormatLite::FieldType>(field_type))) {
      case WireFormatLite::CPPTYPE_INT32:
        extension->ptr.repeated_int32_t_value =
            Arena::Create<RepeatedField<int32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_INT64:
        extension->ptr.repeated_int64_t_value =
            Arena::Create<RepeatedField<int64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT32:
        extension->ptr.repeated_uint32_t_value =
            Arena::Create<RepeatedField<uint32_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_UINT64:
        extension->ptr.repeated_uint64_t_value =
            Arena::Create<RepeatedField<uint64_t>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_DOUBLE:
        extension->ptr.repeated_double_value =
            Arena::Create<RepeatedField<double>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_FLOAT:
        extension->ptr.repeated_float_value =
            Arena::Create<RepeatedField<float>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_BOOL:
        extension->ptr.repeated_bool_value =
            Arena::Create<RepeatedField<bool>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_ENUM:
        extension->ptr.repeated_enum_value =
            Arena::Create<RepeatedField<int>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_STRING:
        extension->ptr.repeated_string_value =
            Arena::Create<RepeatedPtrField<std::string>>(arena_);
        break;
      case WireFormatLite::CPPTYPE_MESSAGE:
        extension->ptr.repeated_message_value =
            Arena::Create<RepeatedPtrField<MessageLite>>(arena_);
        break;
    }
  }

  // We assume that all the RepeatedField<>* pointers have the same
  // size and alignment within the anonymous union in Extension.
  return extension->ptr.repeated_int32_t_value;
}